

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O3

bool cmSystemTools::ChangeRPath
               (string *file,string *oldRPath,string *newRPath,string *emsg,bool *changed)

{
  string *this;
  ulong uVar1;
  long lVar2;
  StringEntry *pSVar3;
  StringEntry *pSVar4;
  char *pcVar5;
  size_type sVar6;
  size_t sVar7;
  long *plVar8;
  ostream *poVar9;
  undefined1 *puVar10;
  byte bVar11;
  uint uVar12;
  string *psVar13;
  ulong uVar14;
  string *psVar15;
  bool bVar16;
  char *se_name [2];
  StringEntry *se [2];
  cmELF elf;
  ostringstream e;
  cmSystemToolsRPathInfo rp [2];
  undefined1 local_398 [4];
  uint local_394;
  string *local_390;
  bool *local_388;
  string *local_380;
  string *local_378;
  uint local_36c;
  string *local_368;
  ulong local_360;
  StringEntry *local_358 [2];
  long local_348 [3];
  cmELF local_330;
  StringEntry *local_308;
  string *local_300;
  long *local_2f8 [2];
  long local_2e8 [2];
  undefined1 local_2d8 [16];
  _func_int *local_2c8 [2];
  byte abStack_2b8 [80];
  ios_base local_268 [136];
  ios_base local_1e0 [264];
  pointer local_d8 [2];
  ulong local_c8 [2];
  undefined1 local_b8 [16];
  string local_a8 [8];
  ulong local_a0 [11];
  long local_48 [3];
  
  if (changed != (bool *)0x0) {
    *changed = false;
  }
  lVar2 = 0xa0;
  puVar10 = local_b8;
  do {
    *(undefined1 **)(puVar10 + -0x10) = puVar10;
    *(undefined8 *)(puVar10 + -8) = 0;
    *puVar10 = 0;
    *(undefined1 **)(puVar10 + 0x10) = puVar10 + 0x20;
    *(undefined8 *)(puVar10 + 0x18) = 0;
    puVar10[0x20] = 0;
    puVar10 = puVar10 + 0x50;
    lVar2 = lVar2 + -0x50;
  } while (lVar2 != 0);
  local_390 = oldRPath;
  local_378 = newRPath;
  cmELF::cmELF(&local_330,(file->_M_dataplus)._M_p);
  local_348[0] = 0;
  local_348[1] = 0;
  local_358[0] = (StringEntry *)0x0;
  local_358[1] = (StringEntry *)0x0;
  pSVar3 = cmELF::GetRPath(&local_330);
  bVar16 = pSVar3 != (StringEntry *)0x0;
  if (bVar16) {
    local_358[0] = (StringEntry *)0x5c6d51;
    local_348[0] = (long)pSVar3;
  }
  pSVar4 = cmELF::GetRunPath(&local_330);
  if (pSVar4 == (StringEntry *)0x0) {
    pcVar5 = (char *)0x0;
    local_360 = 1;
    if (pSVar3 == (StringEntry *)0x0) {
      bVar16 = local_378->_M_string_length == 0;
      if (emsg != (string *)0x0 && !bVar16) {
        std::__cxx11::string::_M_replace((ulong)emsg,0,(char *)emsg->_M_string_length,0x5ac771);
        std::__cxx11::string::_M_append((char *)emsg,(ulong)local_330.ErrorMessage._M_dataplus._M_p)
        ;
      }
      cmELF::~cmELF(&local_330);
      goto LAB_0035fb9d;
    }
  }
  else {
    *(StringEntry **)((long)local_348 + (ulong)((uint)bVar16 * 8)) = pSVar4;
    pcVar5 = "RUNPATH";
    *(char **)((long)local_358 + (ulong)((uint)bVar16 * 8)) = "RUNPATH";
    local_360 = (ulong)(bVar16 + 1);
  }
  local_394 = (uint)CONCAT71((int7)((ulong)pcVar5 >> 8),1);
  uVar14 = 0;
  uVar12 = 0;
  local_388 = changed;
  local_380 = emsg;
  local_368 = file;
  do {
    if (uVar12 == 0) {
      psVar13 = (string *)local_348[uVar14];
LAB_0035f60c:
      sVar6 = cmSystemToolsFindRPath(psVar13,local_390);
      if (sVar6 == 0xffffffffffffffff) {
        sVar6 = cmSystemToolsFindRPath(psVar13,local_378);
        psVar15 = local_380;
        if (sVar6 == 0xffffffffffffffff) {
          if (local_380 != (string *)0x0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2d8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2d8,"The current ",0xc);
            pSVar3 = local_358[uVar14];
            if (pSVar3 == (StringEntry *)0x0) {
              std::ios::clear((int)(local_398 + (long)*(_func_int **)(local_2d8._0_8_ + -0x18)) +
                              0xc0);
            }
            else {
              sVar7 = strlen((char *)pSVar3);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2d8,(char *)pSVar3,sVar7);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2d8," is:\n",5);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2d8,"  ",2);
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_2d8,(psVar13->_M_dataplus)._M_p,
                                psVar13->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar9,"which does not contain:\n",0x18);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"  ",2);
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar9,(local_390->_M_dataplus)._M_p,local_390->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"as was expected.",0x10);
            std::__cxx11::stringbuf::str();
            std::__cxx11::string::operator=((string *)psVar15,(string *)local_2f8);
            if (local_2f8[0] != local_2e8) {
              operator_delete(local_2f8[0],local_2e8[0] + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2d8);
            std::ios_base::~ios_base(local_268);
          }
          goto LAB_0035fb91;
        }
        local_394 = 0;
        emsg = local_380;
      }
      else {
        lVar2 = (long)(int)uVar12;
        uVar1 = psVar13[1]._M_string_length;
        local_d8[lVar2 * 10] = psVar13[1]._M_dataplus._M_p;
        local_c8[lVar2 * 10 + -1] = uVar1;
        local_300 = psVar13;
        pSVar3 = local_358[uVar14];
        pcVar5 = (char *)local_c8[lVar2 * 10 + 1];
        local_36c = uVar12;
        strlen((char *)pSVar3);
        psVar13 = local_300;
        local_308 = pSVar3;
        std::__cxx11::string::_M_replace((ulong)(local_c8 + lVar2 * 10),0,pcVar5,(ulong)pSVar3);
        std::__cxx11::string::substr((ulong)local_2d8,(ulong)psVar13);
        this = local_a8 + lVar2 * 0x50;
        std::__cxx11::string::operator=(this,(string *)local_2d8);
        if ((_func_int **)local_2d8._0_8_ != local_2c8) {
          operator_delete((void *)local_2d8._0_8_,(ulong)(local_2c8[0] + 1));
        }
        std::__cxx11::string::_M_append((char *)this,(ulong)(local_378->_M_dataplus)._M_p);
        emsg = local_380;
        std::__cxx11::string::substr((ulong)local_2d8,(ulong)psVar13);
        std::__cxx11::string::_M_append((char *)this,local_2d8._0_8_);
        changed = local_388;
        if ((_func_int **)local_2d8._0_8_ != local_2c8) {
          operator_delete((void *)local_2d8._0_8_,(ulong)(local_2c8[0] + 1));
        }
        uVar1 = local_a0[lVar2 * 10];
        if (local_c8[lVar2 * 10 + -1] < uVar1 + 1) {
          if (emsg != (string *)0x0) {
            std::__cxx11::string::_M_replace((ulong)emsg,0,(char *)emsg->_M_string_length,0x5ac7e1);
            std::__cxx11::string::append((char *)emsg);
            std::__cxx11::string::append((char *)emsg);
          }
LAB_0035fb91:
          cmELF::~cmELF(&local_330);
          bVar16 = false;
          goto LAB_0035fb9d;
        }
        uVar12 = local_36c + 1;
        local_394 = (uint)CONCAT71((int7)(uVar1 >> 8),uVar1 == 0 & (byte)local_394);
      }
    }
    else {
      psVar13 = (string *)local_348[uVar14];
      if (local_d8[0] != psVar13[1]._M_dataplus._M_p) goto LAB_0035f60c;
    }
    uVar14 = uVar14 + 1;
  } while (local_360 != uVar14);
  cmELF::~cmELF(&local_330);
  bVar16 = true;
  if (uVar12 != 0) {
    if ((local_394 & 1) == 0) {
      std::ofstream::ofstream(local_2d8,(local_368->_M_dataplus)._M_p,_S_out|_S_in|_S_bin);
      if ((abStack_2b8[(long)*(_func_int **)(local_2d8._0_8_ + -0x18)] & 5) == 0) {
        if ((int)uVar12 < 1) {
          bVar11 = 0;
        }
        else {
          local_390 = (string *)(ulong)uVar12;
          psVar13 = (string *)0x0;
          do {
            plVar8 = (long *)std::ostream::seekp((ostream *)local_2d8,local_d8[(long)psVar13 * 10],0
                                                );
            psVar15 = local_380;
            if ((*(byte *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20) & 5) != 0) {
              if (local_380 == (string *)0x0) {
                bVar11 = 1;
                changed = local_388;
              }
              else {
                std::__cxx11::string::operator=((string *)local_380,"Error seeking to ");
                changed = local_388;
                std::__cxx11::string::_M_append((char *)psVar15,local_c8[(long)psVar13 * 10]);
LAB_0035fc69:
                bVar11 = 1;
                std::__cxx11::string::append((char *)psVar15);
              }
              goto LAB_0035fc80;
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2d8,*(char **)(local_a8 + (long)psVar13 * 0x50),
                       local_a0[(long)psVar13 * 10]);
            for (uVar14 = local_a0[(long)psVar13 * 10]; psVar15 = local_380, changed = local_388,
                uVar14 < local_c8[(long)psVar13 * 10 + -1]; uVar14 = uVar14 + 1) {
              local_330.Internal._0_1_ = 0;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2d8,(char *)&local_330,1);
            }
            if ((abStack_2b8[(long)*(_func_int **)(local_2d8._0_8_ + -0x18)] & 5) != 0) {
              if (local_380 != (string *)0x0) {
                std::__cxx11::string::operator=((string *)local_380,"Error writing the new ");
                std::__cxx11::string::_M_append((char *)psVar15,local_c8[(long)psVar13 * 10]);
                goto LAB_0035fc69;
              }
              bVar11 = 1;
              goto LAB_0035fc80;
            }
            psVar13 = (string *)((long)&(psVar13->_M_dataplus)._M_p + 1);
          } while (psVar13 != local_390);
          bVar11 = 0;
        }
      }
      else {
        bVar11 = 1;
        if (emsg != (string *)0x0) {
          std::__cxx11::string::_M_replace((ulong)emsg,0,(char *)emsg->_M_string_length,0x5ac813);
        }
      }
LAB_0035fc80:
      local_2d8._0_8_ = _VTT;
      *(undefined8 *)(local_2d8 + (long)_VTT[-3]) = __M_insert<void_const*>;
      std::filebuf::~filebuf((filebuf *)(local_2d8 + 8));
      std::ios_base::~ios_base(local_1e0);
      if (changed == (bool *)0x0 || bVar11 != 0) {
        bVar16 = (bool)(bVar11 ^ 1);
      }
      else {
        *changed = true;
      }
    }
    else {
      bVar16 = RemoveRPath(local_368,emsg,changed);
    }
  }
LAB_0035fb9d:
  lVar2 = -0xa0;
  plVar8 = local_48;
  do {
    if (plVar8 != (long *)plVar8[-2]) {
      operator_delete((long *)plVar8[-2],*plVar8 + 1);
    }
    if (plVar8 + -4 != (long *)plVar8[-6]) {
      operator_delete((long *)plVar8[-6],plVar8[-4] + 1);
    }
    plVar8 = plVar8 + -10;
    lVar2 = lVar2 + 0x50;
  } while (lVar2 != 0);
  return bVar16;
}

Assistant:

bool cmSystemTools::ChangeRPath(std::string const& file,
                                std::string const& oldRPath,
                                std::string const& newRPath,
                                std::string* emsg,
                                bool* changed)
{
#if defined(CMAKE_USE_ELF_PARSER)
  if(changed)
    {
    *changed = false;
    }
  int rp_count = 0;
  bool remove_rpath = true;
  cmSystemToolsRPathInfo rp[2];
  {
  // Parse the ELF binary.
  cmELF elf(file.c_str());

  // Get the RPATH and RUNPATH entries from it.
  int se_count = 0;
  cmELF::StringEntry const* se[2] = {0, 0};
  const char* se_name[2] = {0, 0};
  if(cmELF::StringEntry const* se_rpath = elf.GetRPath())
    {
    se[se_count] = se_rpath;
    se_name[se_count] = "RPATH";
    ++se_count;
    }
  if(cmELF::StringEntry const* se_runpath = elf.GetRunPath())
    {
    se[se_count] = se_runpath;
    se_name[se_count] = "RUNPATH";
    ++se_count;
    }
  if(se_count == 0)
    {
    if(newRPath.empty())
      {
      // The new rpath is empty and there is no rpath anyway so it is
      // okay.
      return true;
      }
    else
      {
      if(emsg)
        {
        *emsg = "No valid ELF RPATH or RUNPATH entry exists in the file; ";
        *emsg += elf.GetErrorMessage();
        }
      return false;
      }
    }

  for(int i=0; i < se_count; ++i)
    {
    // If both RPATH and RUNPATH refer to the same string literal it
    // needs to be changed only once.
    if(rp_count && rp[0].Position == se[i]->Position)
      {
      continue;
      }

    // Make sure the current rpath contains the old rpath.
    std::string::size_type pos =
      cmSystemToolsFindRPath(se[i]->Value, oldRPath);
    if(pos == std::string::npos)
      {
      // If it contains the new rpath instead then it is okay.
      if(cmSystemToolsFindRPath(se[i]->Value, newRPath) != std::string::npos)
        {
        remove_rpath = false;
        continue;
        }
      if(emsg)
        {
        std::ostringstream e;
        e << "The current " << se_name[i] << " is:\n"
          << "  " << se[i]->Value << "\n"
          << "which does not contain:\n"
          << "  " << oldRPath << "\n"
          << "as was expected.";
        *emsg = e.str();
        }
      return false;
      }

    // Store information about the entry in the file.
    rp[rp_count].Position = se[i]->Position;
    rp[rp_count].Size = se[i]->Size;
    rp[rp_count].Name = se_name[i];

    std::string::size_type prefix_len = pos;

    // If oldRPath was at the end of the file's RPath, and newRPath is empty,
    // we should remove the unnecessary ':' at the end.
    if (newRPath.empty() &&
        pos > 0 &&
        se[i]->Value[pos - 1] == ':' &&
        pos + oldRPath.length() == se[i]->Value.length())
      {
      prefix_len--;
      }

    // Construct the new value which preserves the part of the path
    // not being changed.
    rp[rp_count].Value = se[i]->Value.substr(0, prefix_len);
    rp[rp_count].Value += newRPath;
    rp[rp_count].Value += se[i]->Value.substr(pos+oldRPath.length(),
                                              oldRPath.npos);

    if (!rp[rp_count].Value.empty())
      {
      remove_rpath = false;
      }

    // Make sure there is enough room to store the new rpath and at
    // least one null terminator.
    if(rp[rp_count].Size < rp[rp_count].Value.length()+1)
      {
      if(emsg)
        {
        *emsg = "The replacement path is too long for the ";
        *emsg += se_name[i];
        *emsg += " entry.";
        }
      return false;
      }

    // This entry is ready for update.
    ++rp_count;
    }
  }

  // If no runtime path needs to be changed, we are done.
  if(rp_count == 0)
    {
    return true;
    }

  // If the resulting rpath is empty, just remove the entire entry instead.
  if (remove_rpath)
    {
    return cmSystemTools::RemoveRPath(file, emsg, changed);
    }

  {
  // Open the file for update.
  cmsys::ofstream f(file.c_str(),
                  std::ios::in | std::ios::out | std::ios::binary);
  if(!f)
    {
    if(emsg)
      {
      *emsg = "Error opening file for update.";
      }
    return false;
    }

  // Store the new RPATH and RUNPATH strings.
  for(int i=0; i < rp_count; ++i)
    {
    // Seek to the RPATH position.
    if(!f.seekp(rp[i].Position))
      {
      if(emsg)
        {
        *emsg = "Error seeking to ";
        *emsg += rp[i].Name;
        *emsg += " position.";
        }
      return false;
      }

    // Write the new rpath.  Follow it with enough null terminators to
    // fill the string table entry.
    f << rp[i].Value;
    for(unsigned long j=rp[i].Value.length(); j < rp[i].Size; ++j)
      {
      f << '\0';
      }

    // Make sure it wrote correctly.
    if(!f)
      {
      if(emsg)
        {
        *emsg = "Error writing the new ";
        *emsg += rp[i].Name;
        *emsg += " string to the file.";
        }
      return false;
      }
    }
  }

  // Everything was updated successfully.
  if(changed)
    {
    *changed = true;
    }
  return true;
#else
  (void)file;
  (void)oldRPath;
  (void)newRPath;
  (void)emsg;
  (void)changed;
  return false;
#endif
}